

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpParser.h
# Opt level: O0

string_view __thiscall uWS::HttpRequest::getHeader(HttpRequest *this,string_view lowerCasedHeader)

{
  string_view key;
  string_view sVar1;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  size_type sVar5;
  const_pointer __s1;
  const_pointer __s2;
  size_t in_RDX;
  BloomFilter *in_RSI;
  basic_string_view<char,_std::char_traits<char>_> *in_RDI;
  basic_string_view<char,_std::char_traits<char>_> *this_00;
  Header *h;
  basic_string_view<char,_std::char_traits<char>_> *local_40;
  char *in_stack_fffffffffffffff0;
  char *local_8;
  
  key._M_str = in_stack_fffffffffffffff0;
  key._M_len = in_RDX;
  bVar2 = BloomFilter::mightHave(in_RSI,key);
  this_00 = in_RDI;
  if (bVar2) {
    do {
      do {
        local_40 = this_00;
        this_00 = local_40 + 2;
        sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::length(this_00);
        if (sVar4 == 0) goto LAB_00240f9c;
        sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::length(this_00);
        sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::length
                          ((basic_string_view<char,_std::char_traits<char>_> *)
                           &stack0xffffffffffffffe0);
      } while (sVar4 != sVar5);
      __s1 = std::basic_string_view<char,_std::char_traits<char>_>::data(this_00);
      __s2 = std::basic_string_view<char,_std::char_traits<char>_>::data
                       ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffffe0
                       );
      sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::length
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         &stack0xffffffffffffffe0);
      iVar3 = strncmp(__s1,__s2,sVar4);
    } while (iVar3 != 0);
    in_stack_fffffffffffffff0 = (char *)local_40[3]._M_len;
    local_8 = local_40[3]._M_str;
  }
  else {
LAB_00240f9c:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xfffffffffffffff0,
               (char *)0x0,0);
  }
  sVar1._M_str = local_8;
  sVar1._M_len = (size_t)in_stack_fffffffffffffff0;
  return sVar1;
}

Assistant:

std::string_view getHeader(std::string_view lowerCasedHeader) {
        if (bf.mightHave(lowerCasedHeader)) {
            for (Header *h = headers; (++h)->key.length(); ) {
                if (h->key.length() == lowerCasedHeader.length() && !strncmp(h->key.data(), lowerCasedHeader.data(), lowerCasedHeader.length())) {
                    return h->value;
                }
            }
        }
        return std::string_view(nullptr, 0);
    }